

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O2

void __thiscall
boost::runtime::enum_parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0>::
enum_parameter<boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<std::initializer_list<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::unit_test::output_format>>const,boost::runtime::(anonymous_namespace)::enum_values_t,std::initializer_list<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::unit_test::output_format>>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::output_format_const,boost::runtime::(anonymous_namespace)::default_value_t,boost::unit_test::output_format_const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>>>>
          (enum_parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0> *this,
          cstring *name,
          named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>,_boost::runtime::(anonymous_namespace)::enum_values_t,_const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::default_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>_>
          *m)

{
  enum_parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0> *peVar1;
  named_parameter<const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>,_boost::runtime::(anonymous_namespace)::enum_values_t,_const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>_&>
  *pnVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  iterator pvVar4;
  iterator pvVar5;
  ref_type pbVar6;
  ref_type pbVar7;
  res_type pbVar8;
  size_t sVar9;
  ref_type piVar10;
  res_type poVar11;
  iterator ppVar12;
  iterator __x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_cstring<const_char> local_a8;
  value_type local_98;
  undefined8 local_97;
  undefined4 local_8f;
  undefined2 local_8b;
  enum_parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0> local_89;
  cstring local_88;
  cstring local_70;
  cstring local_60;
  function1<void,_boost::unit_test::basic_cstring<const_char>_> local_50;
  
  pvVar4 = name->m_begin;
  pvVar5 = name->m_end;
  *(undefined ***)this = &PTR__basic_param_001e0df0;
  *(enum_parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0> **)(this + 8) =
       this + 0x18;
  std::__cxx11::string::_M_construct<char_const*>((string *)(this + 8),pvVar4);
  paVar3 = &local_e8.field_2;
  local_e8._M_string_length = 0;
  local_e8.field_2._M_local_buf[0] = '\0';
  local_e8._M_dataplus._M_p = (pointer)paVar3;
  pbVar6 = nfp::
           named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>
           ::operator[]((named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>
                         *)m);
  local_108._M_dataplus._M_p = pbVar6->m_begin;
  local_108._M_string_length = (size_type)pbVar6->m_end;
  unit_test::assign_op<char,char_const>(&local_e8,(basic_cstring<const_char> *)&local_108,0);
  peVar1 = this + 0x38;
  *(enum_parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0> **)(this + 0x28)
       = peVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p == paVar3) {
    *(ulong *)peVar1 =
         CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,local_e8.field_2._M_local_buf[0]);
    *(undefined8 *)(this + 0x40) = local_e8.field_2._8_8_;
  }
  else {
    *(pointer *)(this + 0x28) = local_e8._M_dataplus._M_p;
    *(ulong *)peVar1 =
         CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,local_e8.field_2._M_local_buf[0]);
  }
  *(size_type *)(this + 0x30) = local_e8._M_string_length;
  local_e8._M_string_length = 0;
  local_e8.field_2._M_local_buf[0] = '\0';
  local_e8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::~string((string *)&local_e8);
  paVar3 = &local_108.field_2;
  local_108._M_string_length = 0;
  local_108.field_2._M_local_buf[0] = '\0';
  local_108._M_dataplus._M_p = (pointer)paVar3;
  pbVar7 = nfp::
           named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>
           ::operator[](&m->m_param);
  local_c8._M_dataplus._M_p = pbVar7->m_begin;
  local_c8._M_string_length = (size_type)pbVar7->m_end;
  unit_test::assign_op<char,char_const>(&local_108,(basic_cstring<const_char> *)&local_c8,0);
  peVar1 = this + 0x58;
  *(enum_parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0> **)(this + 0x48)
       = peVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p == paVar3) {
    *(ulong *)peVar1 =
         CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,local_108.field_2._M_local_buf[0]);
    *(undefined8 *)(this + 0x60) = local_108.field_2._8_8_;
  }
  else {
    *(pointer *)(this + 0x48) = local_108._M_dataplus._M_p;
    *(ulong *)peVar1 =
         CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,local_108.field_2._M_local_buf[0]);
  }
  *(size_type *)(this + 0x50) = local_108._M_string_length;
  local_108._M_string_length = 0;
  local_108.field_2._M_local_buf[0] = '\0';
  local_108._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::~string((string *)&local_108);
  paVar3 = &local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  local_c8._M_dataplus._M_p = (pointer)paVar3;
  pbVar8 = nfp::
           named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>
           ::operator[]((named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>
                         *)m);
  local_a8.m_begin = pbVar8->m_begin;
  local_a8.m_end = pbVar8->m_end;
  unit_test::assign_op<char,char_const>(&local_c8,&local_a8,0);
  peVar1 = this + 0x78;
  *(enum_parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0> **)(this + 0x68)
       = peVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p == paVar3) {
    *(ulong *)peVar1 =
         CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,local_c8.field_2._M_local_buf[0]);
    *(undefined8 *)(this + 0x80) = local_c8.field_2._8_8_;
  }
  else {
    *(pointer *)(this + 0x68) = local_c8._M_dataplus._M_p;
    *(ulong *)peVar1 =
         CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,local_c8.field_2._M_local_buf[0]);
  }
  *(size_type *)(this + 0x70) = local_c8._M_string_length;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  local_c8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::~string((string *)&local_c8);
  local_a8.m_begin = &local_98;
  *(enum_parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0> **)(this + 0x88)
       = this + 0x98;
  this[0x98] = (enum_parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0>)0x0;
  *(undefined8 *)(this + 0x99) = local_97;
  *(undefined4 *)(this + 0xa1) = local_8f;
  *(undefined2 *)(this + 0xa5) = local_8b;
  this[0xa7] = local_89;
  *(undefined8 *)(this + 0x90) = 0;
  local_a8.m_end = (iterator)0x0;
  local_98 = '\0';
  std::__cxx11::string::~string((string *)&local_a8);
  *(undefined2 *)(this + 0xa8) = 1;
  this[0xaa] = (enum_parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0>)0x0;
  this[0xab] = (enum_parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0>)
               ((m->
                super_named_parameter_combine<boost::nfp::named_parameter<const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>,_boost::runtime::(anonymous_namespace)::enum_values_t,_const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::default_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>
                ).
                super_named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::default_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>
                .m_param.m_erased ^ 1);
  local_50.super_function_base.vtable = (vtable_base *)0x0;
  function1<void,_boost::unit_test::basic_cstring<const_char>_>::function1
            ((function1<void,_boost::unit_test::basic_cstring<const_char>_> *)(this + 0xb0),
             &local_50);
  function1<void,_boost::unit_test::basic_cstring<const_char>_>::~function1(&local_50);
  *(undefined8 *)(this + 0xd0) = 0;
  *(undefined8 *)(this + 0xd8) = 0;
  *(undefined8 *)(this + 0xe0) = 0;
  local_88.m_begin = (iterator)help_prefix._0_8_;
  local_88.m_end = (iterator)help_prefix._8_8_;
  local_70.m_begin = ":";
  local_60.m_begin = pvVar4;
  local_60.m_end = pvVar5;
  sVar9 = unit_test::ut_detail::bcs_char_traits_impl<const_char>::length(":");
  local_70.m_end = "MESSAGE:" + sVar9 + 7;
  basic_param::add_cla_id((basic_param *)this,&local_88,&local_60,&local_70);
  *(undefined ***)this = &PTR__parameter_001e14e0;
  pnVar2 = &(m->
            super_named_parameter_combine<boost::nfp::named_parameter<const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>,_boost::runtime::(anonymous_namespace)::enum_values_t,_const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::default_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>
            ).m_param;
  piVar10 = nfp::
            named_parameter<const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>,_boost::runtime::(anonymous_namespace)::enum_values_t,_const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>_&>
            ::operator[](pnVar2);
  std::
  map<boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>_>
  ::map((map<boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>_>
         *)(this + 0xe8),*piVar10,(less<boost::unit_test::basic_cstring<const_char>_> *)&local_e8,
        (allocator_type *)&local_108);
  *(undefined4 *)(this + 0x118) = 0;
  poVar11 = nfp::
            named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::default_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>
            ::operator[]((named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::default_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>
                          *)m);
  *(output_format *)(this + 0x11c) = *poVar11;
  *(undefined ***)this = &PTR__enum_parameter_001e1458;
  *(undefined8 *)(this + 0x120) = 0;
  *(undefined8 *)(this + 0x128) = 0;
  *(undefined8 *)(this + 0x130) = 0;
  piVar10 = nfp::
            named_parameter<const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>,_boost::runtime::(anonymous_namespace)::enum_values_t,_const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>_&>
            ::operator[](pnVar2);
  ppVar12 = piVar10->_M_array;
  for (__x = ppVar12; __x != ppVar12 + piVar10->_M_len; __x = __x + 1) {
    std::
    vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
    ::push_back((vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
                 *)(this + 0x120),&__x->first);
    ppVar12 = piVar10->_M_array;
  }
  return;
}

Assistant:

enum_parameter( cstring name, Modifiers const& m )
#endif
    : base( name, m )
    {
#ifdef BOOST_TEST_CLA_NEW_API
        auto const& values = m[enum_values<EnumType>::value];
        auto it = values.begin();
#else
        std::vector<std::pair<cstring, EnumType> > const& values = m[enum_values<EnumType>::value];
        typename std::vector<std::pair<cstring, EnumType> >::const_iterator it = values.begin();
#endif
        while( it != values.end() ) {
            m_valid_names.push_back( it->first );
            ++it;
        }
    }